

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_core_validation.cpp
# Opt level: O2

XrResult ValidateXrStruct(GenValidUsageXrInstanceInfo *instance_info,string *command_name,
                         vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                         *objects_info,bool check_members,bool check_pnext,XrFrameEndInfo *value)

{
  XrEnvironmentBlendMode XVar1;
  XrStructureType XVar2;
  XrCompositionLayerEquirect2KHR *value_00;
  GenValidUsageXrInstanceInfo *instance_info_00;
  NextChainResult NVar3;
  uint uVar4;
  XrResult XVar5;
  XrResult XVar6;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *this;
  ulong uVar7;
  uint32_t in_stack_fffffffffffffc5c;
  string local_3a0;
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *local_380;
  GenValidUsageXrInstanceInfo *local_378;
  allocator local_36a;
  allocator local_369;
  string local_368;
  vector<XrStructureType,_std::allocator<XrStructureType>_> valid_ext_structs;
  string error_message;
  vector<XrStructureType,_std::allocator<XrStructureType>_> duplicate_ext_structs;
  vector<XrStructureType,_std::allocator<XrStructureType>_> encountered_structs;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_180;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_168;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_150;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_138;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_120;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_108;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_f0;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_d8;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_c0;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_a8;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_90;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_78;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_60;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_48;
  
  XVar6 = XR_SUCCESS;
  local_380 = objects_info;
  if (value->type != XR_TYPE_FRAME_END_INFO) {
    XVar6 = XR_ERROR_VALIDATION_FAILURE;
    InvalidStructureType
              (instance_info,command_name,objects_info,"XrFrameEndInfo",value->type,
               "VUID-XrFrameEndInfo-type-type",XR_TYPE_FRAME_END_INFO,"XR_TYPE_FRAME_END_INFO");
  }
  if (check_pnext) {
    valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    duplicate_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    encountered_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    duplicate_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    duplicate_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    encountered_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    encountered_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    error_message._M_dataplus._M_p._0_4_ = 0x3b9cd958;
    std::vector<XrStructureType,_std::allocator<XrStructureType>_>::emplace_back<XrStructureType>
              (&valid_ext_structs,(XrStructureType *)&error_message);
    error_message._M_dataplus._M_p._0_4_ = 0x3b9cdd40;
    std::vector<XrStructureType,_std::allocator<XrStructureType>_>::emplace_back<XrStructureType>
              (&valid_ext_structs,(XrStructureType *)&error_message);
    error_message._M_dataplus._M_p._0_4_ = 0x3b9e15c0;
    std::vector<XrStructureType,_std::allocator<XrStructureType>_>::emplace_back<XrStructureType>
              (&valid_ext_structs,(XrStructureType *)&error_message);
    error_message._M_dataplus._M_p._0_4_ = 0x3b9b990b;
    std::vector<XrStructureType,_std::allocator<XrStructureType>_>::emplace_back<XrStructureType>
              (&valid_ext_structs,(XrStructureType *)&error_message);
    NVar3 = ValidateNextChain(instance_info,command_name,local_380,value->next,&valid_ext_structs,
                              &encountered_structs,&duplicate_ext_structs);
    if (NVar3 == NEXT_CHAIN_RESULT_DUPLICATE_STRUCT) {
      std::__cxx11::string::string
                ((string *)&error_message,
                 "Multiple structures of the same type(s) in \"next\" chain for ",
                 (allocator *)&local_3a0);
      std::__cxx11::string::append((char *)&error_message);
      StructTypesToString_abi_cxx11_(&local_3a0,instance_info,&duplicate_ext_structs);
      std::__cxx11::string::append((string *)&error_message);
      std::__cxx11::string::~string((string *)&local_3a0);
      std::__cxx11::string::string
                ((string *)&local_3a0,"VUID-XrFrameEndInfo-next-unique",&local_36a);
      std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
                 &local_60,local_380);
      std::__cxx11::string::string
                ((string *)&local_368,
                 "Multiple structures of the same type(s) in \"next\" chain for XrFrameEndInfo struct"
                 ,&local_369);
      CoreValidLogMessage(instance_info,&local_3a0,VALID_USAGE_DEBUG_SEVERITY_ERROR,command_name,
                          (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                           *)&local_60,&local_368);
      std::__cxx11::string::~string((string *)&local_368);
      std::_Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
      ~_Vector_base(&local_60);
      std::__cxx11::string::~string((string *)&local_3a0);
LAB_00144769:
      std::__cxx11::string::~string((string *)&error_message);
      XVar6 = XR_ERROR_VALIDATION_FAILURE;
    }
    else if (NVar3 == NEXT_CHAIN_RESULT_ERROR) {
      std::__cxx11::string::string
                ((string *)&error_message,"VUID-XrFrameEndInfo-next-next",(allocator *)&local_368);
      std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
                 &local_48,local_380);
      std::__cxx11::string::string
                ((string *)&local_3a0,
                 "Invalid structure(s) in \"next\" chain for XrFrameEndInfo struct \"next\"",
                 &local_36a);
      CoreValidLogMessage(instance_info,&error_message,VALID_USAGE_DEBUG_SEVERITY_ERROR,command_name
                          ,(vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                            *)&local_48,&local_3a0);
      std::__cxx11::string::~string((string *)&local_3a0);
      std::_Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
      ~_Vector_base(&local_48);
      goto LAB_00144769;
    }
    std::_Vector_base<XrStructureType,_std::allocator<XrStructureType>_>::~_Vector_base
              (&encountered_structs.
                super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>);
    std::_Vector_base<XrStructureType,_std::allocator<XrStructureType>_>::~_Vector_base
              (&duplicate_ext_structs.
                super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>);
    std::_Vector_base<XrStructureType,_std::allocator<XrStructureType>_>::~_Vector_base
              (&valid_ext_structs.
                super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>);
  }
  if (!check_members || XVar6 != XR_SUCCESS) {
    return XVar6;
  }
  std::__cxx11::string::string((string *)&error_message,"XrFrameEndInfo",(allocator *)&local_368);
  std::__cxx11::string::string
            ((string *)&local_3a0,"environmentBlendMode",(allocator *)&valid_ext_structs);
  XVar1 = value->environmentBlendMode;
  std::__cxx11::string::~string((string *)&local_3a0);
  std::__cxx11::string::~string((string *)&error_message);
  if (XVar1 - XR_ENVIRONMENT_BLEND_MODE_OPAQUE < 3) {
    uVar4 = value->layerCount;
    if (uVar4 == 0) {
      if (value->layers == (XrCompositionLayerBaseHeader **)0x0) {
        return XR_SUCCESS;
      }
    }
    else if (value->layers == (XrCompositionLayerBaseHeader **)0x0) {
      std::__cxx11::string::string
                ((string *)&error_message,"VUID-XrFrameEndInfo-layers-parameter",
                 (allocator *)&local_368);
      std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
                 &local_90,local_380);
      std::__cxx11::string::string
                ((string *)&local_3a0,
                 "Structure XrFrameEndInfo member layerCount is NULL, but value->layerCount is greater than 0"
                 ,(allocator *)&valid_ext_structs);
      CoreValidLogMessage(instance_info,&error_message,VALID_USAGE_DEBUG_SEVERITY_ERROR,command_name
                          ,(vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                            *)&local_90,&local_3a0);
      std::__cxx11::string::~string((string *)&local_3a0);
      std::_Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
      ~_Vector_base(&local_90);
LAB_00144bf6:
      std::__cxx11::string::~string((string *)&error_message);
      goto LAB_00144c00;
    }
    XVar6 = XR_SUCCESS;
    local_378 = instance_info;
    for (uVar7 = 0; uVar7 < uVar4; uVar7 = uVar7 + 1) {
      value_00 = (XrCompositionLayerEquirect2KHR *)value->layers[uVar7];
      uVar4 = (uint)uVar7;
      if (value_00 == (XrCompositionLayerEquirect2KHR *)0x0) {
        std::__cxx11::string::string
                  ((string *)&error_message,"Structure XrFrameEndInfo member layers",
                   (allocator *)&local_3a0);
        std::__cxx11::string::append((char *)&error_message);
        instance_info_00 = local_378;
        std::__cxx11::to_string(&local_3a0,uVar4);
        std::__cxx11::string::append((string *)&error_message);
        std::__cxx11::string::~string((string *)&local_3a0);
        std::__cxx11::string::append((char *)&error_message);
        std::__cxx11::string::append((char *)&error_message);
        std::__cxx11::string::string
                  ((string *)&local_3a0,"VUID-XrFrameEndInfo-layers-parameter",
                   (allocator *)&local_368);
        std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                  ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
                   &local_a8,local_380);
        CoreValidLogMessage(instance_info_00,&local_3a0,VALID_USAGE_DEBUG_SEVERITY_ERROR,
                            command_name,
                            (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                             *)&local_a8,&error_message);
        this = &local_a8;
LAB_00144be7:
        std::_Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
        ~_Vector_base(this);
        std::__cxx11::string::~string((string *)&local_3a0);
        goto LAB_00144bf6;
      }
      XVar2 = value_00->type;
      if (XVar2 == XR_TYPE_COMPOSITION_LAYER_PASSTHROUGH_HTC) {
        XVar5 = ValidateXrStruct(local_378,command_name,local_380,true,true,
                                 (XrCompositionLayerPassthroughHTC *)value_00);
        if (XVar5 != XR_SUCCESS) {
          std::__cxx11::string::string
                    ((string *)&error_message,"Structure XrFrameEndInfo member layers",
                     (allocator *)&local_3a0);
          std::__cxx11::string::append((char *)&error_message);
          std::__cxx11::to_string(&local_3a0,uVar4);
          std::__cxx11::string::append((string *)&error_message);
          std::__cxx11::string::~string((string *)&local_3a0);
          std::__cxx11::string::append((char *)&error_message);
          std::__cxx11::string::append((char *)&error_message);
          std::__cxx11::string::string
                    ((string *)&local_3a0,"VUID-XrFrameEndInfo-layers-parameter",
                     (allocator *)&local_368);
          std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                    ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                      *)&local_168,local_380);
          CoreValidLogMessage(local_378,&local_3a0,VALID_USAGE_DEBUG_SEVERITY_ERROR,command_name,
                              (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                               *)&local_168,&error_message);
          this = &local_168;
          goto LAB_00144be7;
        }
      }
      else if (XVar2 == XR_TYPE_COMPOSITION_LAYER_QUAD) {
        XVar5 = ValidateXrStruct(local_378,command_name,local_380,true,true,
                                 (XrCompositionLayerQuad *)value_00);
        if (XVar5 != XR_SUCCESS) {
          std::__cxx11::string::string
                    ((string *)&error_message,"Structure XrFrameEndInfo member layers",
                     (allocator *)&local_3a0);
          std::__cxx11::string::append((char *)&error_message);
          std::__cxx11::to_string(&local_3a0,uVar4);
          std::__cxx11::string::append((string *)&error_message);
          std::__cxx11::string::~string((string *)&local_3a0);
          std::__cxx11::string::append((char *)&error_message);
          std::__cxx11::string::append((char *)&error_message);
          std::__cxx11::string::string
                    ((string *)&local_3a0,"VUID-XrFrameEndInfo-layers-parameter",
                     (allocator *)&local_368);
          std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                    ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                      *)&local_d8,local_380);
          CoreValidLogMessage(local_378,&local_3a0,VALID_USAGE_DEBUG_SEVERITY_ERROR,command_name,
                              (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                               *)&local_d8,&error_message);
          this = &local_d8;
          goto LAB_00144be7;
        }
      }
      else if (XVar2 == XR_TYPE_COMPOSITION_LAYER_CUBE_KHR) {
        XVar5 = ValidateXrStruct(local_378,command_name,local_380,true,true,
                                 (XrCompositionLayerCubeKHR *)value_00);
        if (XVar5 != XR_SUCCESS) {
          std::__cxx11::string::string
                    ((string *)&error_message,"Structure XrFrameEndInfo member layers",
                     (allocator *)&local_3a0);
          std::__cxx11::string::append((char *)&error_message);
          std::__cxx11::to_string(&local_3a0,uVar4);
          std::__cxx11::string::append((string *)&error_message);
          std::__cxx11::string::~string((string *)&local_3a0);
          std::__cxx11::string::append((char *)&error_message);
          std::__cxx11::string::append((char *)&error_message);
          std::__cxx11::string::string
                    ((string *)&local_3a0,"VUID-XrFrameEndInfo-layers-parameter",
                     (allocator *)&local_368);
          std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                    ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                      *)&local_f0,local_380);
          CoreValidLogMessage(local_378,&local_3a0,VALID_USAGE_DEBUG_SEVERITY_ERROR,command_name,
                              (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                               *)&local_f0,&error_message);
          this = &local_f0;
          goto LAB_00144be7;
        }
      }
      else if (XVar2 == XR_TYPE_COMPOSITION_LAYER_CYLINDER_KHR) {
        XVar5 = ValidateXrStruct(local_378,command_name,local_380,true,true,
                                 (XrCompositionLayerCylinderKHR *)value_00);
        if (XVar5 != XR_SUCCESS) {
          std::__cxx11::string::string
                    ((string *)&error_message,"Structure XrFrameEndInfo member layers",
                     (allocator *)&local_3a0);
          std::__cxx11::string::append((char *)&error_message);
          std::__cxx11::to_string(&local_3a0,uVar4);
          std::__cxx11::string::append((string *)&error_message);
          std::__cxx11::string::~string((string *)&local_3a0);
          std::__cxx11::string::append((char *)&error_message);
          std::__cxx11::string::append((char *)&error_message);
          std::__cxx11::string::string
                    ((string *)&local_3a0,"VUID-XrFrameEndInfo-layers-parameter",
                     (allocator *)&local_368);
          std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                    ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                      *)&local_108,local_380);
          CoreValidLogMessage(local_378,&local_3a0,VALID_USAGE_DEBUG_SEVERITY_ERROR,command_name,
                              (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                               *)&local_108,&error_message);
          this = &local_108;
          goto LAB_00144be7;
        }
      }
      else if (XVar2 == XR_TYPE_COMPOSITION_LAYER_EQUIRECT_KHR) {
        XVar5 = ValidateXrStruct(local_378,command_name,local_380,true,true,
                                 (XrCompositionLayerEquirectKHR *)value_00);
        if (XVar5 != XR_SUCCESS) {
          std::__cxx11::string::string
                    ((string *)&error_message,"Structure XrFrameEndInfo member layers",
                     (allocator *)&local_3a0);
          std::__cxx11::string::append((char *)&error_message);
          std::__cxx11::to_string(&local_3a0,uVar4);
          std::__cxx11::string::append((string *)&error_message);
          std::__cxx11::string::~string((string *)&local_3a0);
          std::__cxx11::string::append((char *)&error_message);
          std::__cxx11::string::append((char *)&error_message);
          std::__cxx11::string::string
                    ((string *)&local_3a0,"VUID-XrFrameEndInfo-layers-parameter",
                     (allocator *)&local_368);
          std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                    ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                      *)&local_120,local_380);
          CoreValidLogMessage(local_378,&local_3a0,VALID_USAGE_DEBUG_SEVERITY_ERROR,command_name,
                              (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                               *)&local_120,&error_message);
          this = &local_120;
          goto LAB_00144be7;
        }
      }
      else if (XVar2 == XR_TYPE_COMPOSITION_LAYER_EQUIRECT2_KHR) {
        XVar5 = ValidateXrStruct(local_378,command_name,local_380,true,true,value_00);
        if (XVar5 != XR_SUCCESS) {
          std::__cxx11::string::string
                    ((string *)&error_message,"Structure XrFrameEndInfo member layers",
                     (allocator *)&local_3a0);
          std::__cxx11::string::append((char *)&error_message);
          std::__cxx11::to_string(&local_3a0,uVar4);
          std::__cxx11::string::append((string *)&error_message);
          std::__cxx11::string::~string((string *)&local_3a0);
          std::__cxx11::string::append((char *)&error_message);
          std::__cxx11::string::append((char *)&error_message);
          std::__cxx11::string::string
                    ((string *)&local_3a0,"VUID-XrFrameEndInfo-layers-parameter",
                     (allocator *)&local_368);
          std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                    ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                      *)&local_138,local_380);
          CoreValidLogMessage(local_378,&local_3a0,VALID_USAGE_DEBUG_SEVERITY_ERROR,command_name,
                              (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                               *)&local_138,&error_message);
          this = &local_138;
          goto LAB_00144be7;
        }
      }
      else if (XVar2 == XR_TYPE_COMPOSITION_LAYER_PASSTHROUGH_FB) {
        XVar5 = ValidateXrStruct(local_378,command_name,local_380,true,true,
                                 (XrCompositionLayerPassthroughFB *)value_00);
        if (XVar5 != XR_SUCCESS) {
          std::__cxx11::string::string
                    ((string *)&error_message,"Structure XrFrameEndInfo member layers",
                     (allocator *)&local_3a0);
          std::__cxx11::string::append((char *)&error_message);
          std::__cxx11::to_string(&local_3a0,uVar4);
          std::__cxx11::string::append((string *)&error_message);
          std::__cxx11::string::~string((string *)&local_3a0);
          std::__cxx11::string::append((char *)&error_message);
          std::__cxx11::string::append((char *)&error_message);
          std::__cxx11::string::string
                    ((string *)&local_3a0,"VUID-XrFrameEndInfo-layers-parameter",
                     (allocator *)&local_368);
          std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                    ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                      *)&local_150,local_380);
          CoreValidLogMessage(local_378,&local_3a0,VALID_USAGE_DEBUG_SEVERITY_ERROR,command_name,
                              (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                               *)&local_150,&error_message);
          this = &local_150;
          goto LAB_00144be7;
        }
      }
      else if (XVar2 == XR_TYPE_COMPOSITION_LAYER_PROJECTION) {
        XVar5 = ValidateXrStruct(local_378,command_name,local_380,true,true,
                                 (XrCompositionLayerProjection *)value_00);
        if (XVar5 != XR_SUCCESS) {
          std::__cxx11::string::string
                    ((string *)&error_message,"Structure XrFrameEndInfo member layers",
                     (allocator *)&local_3a0);
          std::__cxx11::string::append((char *)&error_message);
          std::__cxx11::to_string(&local_3a0,uVar4);
          std::__cxx11::string::append((string *)&error_message);
          std::__cxx11::string::~string((string *)&local_3a0);
          std::__cxx11::string::append((char *)&error_message);
          std::__cxx11::string::append((char *)&error_message);
          std::__cxx11::string::string
                    ((string *)&local_3a0,"VUID-XrFrameEndInfo-layers-parameter",
                     (allocator *)&local_368);
          std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                    ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                      *)&local_c0,local_380);
          CoreValidLogMessage(local_378,&local_3a0,VALID_USAGE_DEBUG_SEVERITY_ERROR,command_name,
                              (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                               *)&local_c0,&error_message);
          this = &local_c0;
          goto LAB_00144be7;
        }
      }
      else {
        XVar5 = ValidateXrStruct(local_378,command_name,local_380,true,false,
                                 (XrCompositionLayerBaseHeader *)value_00);
        if (XVar5 != XR_SUCCESS) {
          std::__cxx11::string::string
                    ((string *)&error_message,"VUID-XrFrameEndInfo-layers-parameter",
                     (allocator *)&local_368);
          std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                    ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                      *)&local_180,local_380);
          std::__cxx11::string::string
                    ((string *)&local_3a0,"Structure XrFrameEndInfo member layers is invalid",
                     (allocator *)&valid_ext_structs);
          CoreValidLogMessage(local_378,&error_message,VALID_USAGE_DEBUG_SEVERITY_ERROR,command_name
                              ,(vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                                *)&local_180,&local_3a0);
          std::__cxx11::string::~string((string *)&local_3a0);
          std::_Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
          ~_Vector_base(&local_180);
          std::__cxx11::string::~string((string *)&error_message);
          return XVar5;
        }
      }
      uVar4 = value->layerCount;
    }
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&error_message);
    std::operator<<((ostream *)&error_message,
                    "XrFrameEndInfo contains invalid XrEnvironmentBlendMode \"environmentBlendMode\" enum value "
                   );
    Uint32ToHexString_abi_cxx11_(in_stack_fffffffffffffc5c);
    std::operator<<((ostream *)&error_message,(string *)&local_3a0);
    std::__cxx11::string::~string((string *)&local_3a0);
    std::__cxx11::string::string
              ((string *)&local_3a0,"VUID-XrFrameEndInfo-environmentBlendMode-parameter",
               (allocator *)&valid_ext_structs);
    std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
              ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
               &local_78,local_380);
    std::__cxx11::stringbuf::str();
    CoreValidLogMessage(instance_info,&local_3a0,VALID_USAGE_DEBUG_SEVERITY_ERROR,command_name,
                        (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                         *)&local_78,&local_368);
    std::__cxx11::string::~string((string *)&local_368);
    std::_Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
    ~_Vector_base(&local_78);
    std::__cxx11::string::~string((string *)&local_3a0);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&error_message);
LAB_00144c00:
    XVar6 = XR_ERROR_VALIDATION_FAILURE;
  }
  return XVar6;
}

Assistant:

XrResult ValidateXrStruct(GenValidUsageXrInstanceInfo *instance_info, const std::string &command_name,
                          std::vector<GenValidUsageXrObjectInfo>& objects_info, bool check_members, bool check_pnext,
                          const XrFrameEndInfo* value) {
    XrResult xr_result = XR_SUCCESS;
    (void)xr_result;
    (void)instance_info;
    (void)command_name;
    (void)objects_info;
    (void)check_members;
    (void)value;
    // Make sure the structure type is correct
    if (value->type != XR_TYPE_FRAME_END_INFO) {
        InvalidStructureType(instance_info, command_name, objects_info, "XrFrameEndInfo",
                             value->type, "VUID-XrFrameEndInfo-type-type", XR_TYPE_FRAME_END_INFO, "XR_TYPE_FRAME_END_INFO");
        xr_result = XR_ERROR_VALIDATION_FAILURE;
    }
    if (check_pnext) {
        std::vector<XrStructureType> valid_ext_structs;
        std::vector<XrStructureType> duplicate_ext_structs;
        std::vector<XrStructureType> encountered_structs;
        valid_ext_structs.push_back(XR_TYPE_FRAME_END_INFO_ML);
        valid_ext_structs.push_back(XR_TYPE_GLOBAL_DIMMER_FRAME_END_INFO_ML);
        valid_ext_structs.push_back(XR_TYPE_LOCAL_DIMMING_FRAME_END_INFO_META);
        valid_ext_structs.push_back(XR_TYPE_SECONDARY_VIEW_CONFIGURATION_FRAME_END_INFO_MSFT);
        NextChainResult next_result = ValidateNextChain(instance_info, command_name, objects_info,
                                                         value->next, valid_ext_structs,
                                                         encountered_structs,
                                                         duplicate_ext_structs);
        // No valid extension structs for this 'next'.  Therefore, must be NULL
        // or only contain a list of valid extension structures.
        if (NEXT_CHAIN_RESULT_ERROR == next_result) {
            CoreValidLogMessage(instance_info, "VUID-XrFrameEndInfo-next-next",
                                VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                                objects_info, "Invalid structure(s) in \"next\" chain for XrFrameEndInfo struct \"next\"");
            xr_result = XR_ERROR_VALIDATION_FAILURE;
        } else if (NEXT_CHAIN_RESULT_DUPLICATE_STRUCT == next_result) {
            std::string error_message = "Multiple structures of the same type(s) in \"next\" chain for ";
            error_message += "XrFrameEndInfo : ";
            error_message += StructTypesToString(instance_info, duplicate_ext_structs);
            CoreValidLogMessage(instance_info, "VUID-XrFrameEndInfo-next-unique",
                                VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                                objects_info,
            "Multiple structures of the same type(s) in \"next\" chain for XrFrameEndInfo struct");
            xr_result = XR_ERROR_VALIDATION_FAILURE;
        }
    }
    // If we are not to check the rest of the members, just return here.
    if (!check_members || XR_SUCCESS != xr_result) {
        return xr_result;
    }
    // Make sure the enum type XrEnvironmentBlendMode value is valid
    if (!ValidateXrEnum(instance_info, command_name, "XrFrameEndInfo", "environmentBlendMode", objects_info, value->environmentBlendMode)) {
        std::ostringstream oss_enum;
        oss_enum << "XrFrameEndInfo contains invalid XrEnvironmentBlendMode \"environmentBlendMode\" enum value ";
        oss_enum << Uint32ToHexString(static_cast<uint32_t>(value->environmentBlendMode));
        CoreValidLogMessage(instance_info, "VUID-XrFrameEndInfo-environmentBlendMode-parameter",
                            VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                            objects_info, oss_enum.str());
        return XR_ERROR_VALIDATION_FAILURE;
    }
    // Optional array must be non-NULL when value->layerCount is non-zero
    if (0 != value->layerCount && nullptr == value->layers) {
        CoreValidLogMessage(instance_info, "VUID-XrFrameEndInfo-layers-parameter",
                            VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                            objects_info,
                            "Structure XrFrameEndInfo member layerCount is NULL, but value->layerCount is greater than 0");
        return XR_ERROR_VALIDATION_FAILURE;
    }
    if (value->layers) {
        for (uint32_t value_layers_inc = 0; value_layers_inc < value->layerCount; ++value_layers_inc) {
            if (value->layers[value_layers_inc] == nullptr) {
                std::string error_message = "Structure XrFrameEndInfo member layers";
                error_message += "[";
                error_message += std::to_string(value_layers_inc);
                error_message += "]";
                error_message += " is null";
                CoreValidLogMessage(instance_info, "VUID-XrFrameEndInfo-layers-parameter",
                                    VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                                    objects_info,
                                    error_message);
                return XR_ERROR_VALIDATION_FAILURE;
            }
            // Validate if XrCompositionLayerBaseHeader is a child structure of type XrCompositionLayerProjection and it is valid
            {
                if (value->layers != nullptr) {
                    const XrCompositionLayerProjection* const* new_compositionlayerprojection_value = reinterpret_cast<const XrCompositionLayerProjection* const*>(value->layers);
                    if (new_compositionlayerprojection_value[value_layers_inc]->type == XR_TYPE_COMPOSITION_LAYER_PROJECTION) {
                        if (nullptr != new_compositionlayerprojection_value) {
                            xr_result = ValidateXrStruct(instance_info, command_name,
                                                                            objects_info, check_members, true, new_compositionlayerprojection_value[value_layers_inc]);
                            if (XR_SUCCESS != xr_result) {
                                std::string error_message = "Structure XrFrameEndInfo member layers";
                                error_message += "[";
                                error_message += std::to_string(value_layers_inc);
                                error_message += "]";
                                error_message += " is invalid";
                                CoreValidLogMessage(instance_info, "VUID-XrFrameEndInfo-layers-parameter",
                                                    VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                                                    objects_info,
                                                    error_message);
                                return XR_ERROR_VALIDATION_FAILURE;
                                break;
                            } else {
                                continue;
                                }
                            }
                    }
                }
            }
            // Validate if XrCompositionLayerBaseHeader is a child structure of type XrCompositionLayerQuad and it is valid
            {
                if (value->layers != nullptr) {
                    const XrCompositionLayerQuad* const* new_compositionlayerquad_value = reinterpret_cast<const XrCompositionLayerQuad* const*>(value->layers);
                    if (new_compositionlayerquad_value[value_layers_inc]->type == XR_TYPE_COMPOSITION_LAYER_QUAD) {
                        if (nullptr != new_compositionlayerquad_value) {
                            xr_result = ValidateXrStruct(instance_info, command_name,
                                                                            objects_info, check_members, true, new_compositionlayerquad_value[value_layers_inc]);
                            if (XR_SUCCESS != xr_result) {
                                std::string error_message = "Structure XrFrameEndInfo member layers";
                                error_message += "[";
                                error_message += std::to_string(value_layers_inc);
                                error_message += "]";
                                error_message += " is invalid";
                                CoreValidLogMessage(instance_info, "VUID-XrFrameEndInfo-layers-parameter",
                                                    VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                                                    objects_info,
                                                    error_message);
                                return XR_ERROR_VALIDATION_FAILURE;
                                break;
                            } else {
                                continue;
                                }
                            }
                    }
                }
            }
            // Validate if XrCompositionLayerBaseHeader is a child structure of type XrCompositionLayerCubeKHR and it is valid
            {
                if (value->layers != nullptr) {
                    const XrCompositionLayerCubeKHR* const* new_compositionlayercubekhr_value = reinterpret_cast<const XrCompositionLayerCubeKHR* const*>(value->layers);
                    if (new_compositionlayercubekhr_value[value_layers_inc]->type == XR_TYPE_COMPOSITION_LAYER_CUBE_KHR) {
                        if (nullptr != new_compositionlayercubekhr_value) {
                            xr_result = ValidateXrStruct(instance_info, command_name,
                                                                            objects_info, check_members, true, new_compositionlayercubekhr_value[value_layers_inc]);
                            if (XR_SUCCESS != xr_result) {
                                std::string error_message = "Structure XrFrameEndInfo member layers";
                                error_message += "[";
                                error_message += std::to_string(value_layers_inc);
                                error_message += "]";
                                error_message += " is invalid";
                                CoreValidLogMessage(instance_info, "VUID-XrFrameEndInfo-layers-parameter",
                                                    VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                                                    objects_info,
                                                    error_message);
                                return XR_ERROR_VALIDATION_FAILURE;
                                break;
                            } else {
                                continue;
                                }
                            }
                    }
                }
            }
            // Validate if XrCompositionLayerBaseHeader is a child structure of type XrCompositionLayerCylinderKHR and it is valid
            {
                if (value->layers != nullptr) {
                    const XrCompositionLayerCylinderKHR* const* new_compositionlayercylinderkhr_value = reinterpret_cast<const XrCompositionLayerCylinderKHR* const*>(value->layers);
                    if (new_compositionlayercylinderkhr_value[value_layers_inc]->type == XR_TYPE_COMPOSITION_LAYER_CYLINDER_KHR) {
                        if (nullptr != new_compositionlayercylinderkhr_value) {
                            xr_result = ValidateXrStruct(instance_info, command_name,
                                                                            objects_info, check_members, true, new_compositionlayercylinderkhr_value[value_layers_inc]);
                            if (XR_SUCCESS != xr_result) {
                                std::string error_message = "Structure XrFrameEndInfo member layers";
                                error_message += "[";
                                error_message += std::to_string(value_layers_inc);
                                error_message += "]";
                                error_message += " is invalid";
                                CoreValidLogMessage(instance_info, "VUID-XrFrameEndInfo-layers-parameter",
                                                    VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                                                    objects_info,
                                                    error_message);
                                return XR_ERROR_VALIDATION_FAILURE;
                                break;
                            } else {
                                continue;
                                }
                            }
                    }
                }
            }
            // Validate if XrCompositionLayerBaseHeader is a child structure of type XrCompositionLayerEquirectKHR and it is valid
            {
                if (value->layers != nullptr) {
                    const XrCompositionLayerEquirectKHR* const* new_compositionlayerequirectkhr_value = reinterpret_cast<const XrCompositionLayerEquirectKHR* const*>(value->layers);
                    if (new_compositionlayerequirectkhr_value[value_layers_inc]->type == XR_TYPE_COMPOSITION_LAYER_EQUIRECT_KHR) {
                        if (nullptr != new_compositionlayerequirectkhr_value) {
                            xr_result = ValidateXrStruct(instance_info, command_name,
                                                                            objects_info, check_members, true, new_compositionlayerequirectkhr_value[value_layers_inc]);
                            if (XR_SUCCESS != xr_result) {
                                std::string error_message = "Structure XrFrameEndInfo member layers";
                                error_message += "[";
                                error_message += std::to_string(value_layers_inc);
                                error_message += "]";
                                error_message += " is invalid";
                                CoreValidLogMessage(instance_info, "VUID-XrFrameEndInfo-layers-parameter",
                                                    VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                                                    objects_info,
                                                    error_message);
                                return XR_ERROR_VALIDATION_FAILURE;
                                break;
                            } else {
                                continue;
                                }
                            }
                    }
                }
            }
            // Validate if XrCompositionLayerBaseHeader is a child structure of type XrCompositionLayerEquirect2KHR and it is valid
            {
                if (value->layers != nullptr) {
                    const XrCompositionLayerEquirect2KHR* const* new_compositionlayerequirect2khr_value = reinterpret_cast<const XrCompositionLayerEquirect2KHR* const*>(value->layers);
                    if (new_compositionlayerequirect2khr_value[value_layers_inc]->type == XR_TYPE_COMPOSITION_LAYER_EQUIRECT2_KHR) {
                        if (nullptr != new_compositionlayerequirect2khr_value) {
                            xr_result = ValidateXrStruct(instance_info, command_name,
                                                                            objects_info, check_members, true, new_compositionlayerequirect2khr_value[value_layers_inc]);
                            if (XR_SUCCESS != xr_result) {
                                std::string error_message = "Structure XrFrameEndInfo member layers";
                                error_message += "[";
                                error_message += std::to_string(value_layers_inc);
                                error_message += "]";
                                error_message += " is invalid";
                                CoreValidLogMessage(instance_info, "VUID-XrFrameEndInfo-layers-parameter",
                                                    VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                                                    objects_info,
                                                    error_message);
                                return XR_ERROR_VALIDATION_FAILURE;
                                break;
                            } else {
                                continue;
                                }
                            }
                    }
                }
            }
            // Validate if XrCompositionLayerBaseHeader is a child structure of type XrCompositionLayerPassthroughFB and it is valid
            {
                if (value->layers != nullptr) {
                    const XrCompositionLayerPassthroughFB* const* new_compositionlayerpassthroughfb_value = reinterpret_cast<const XrCompositionLayerPassthroughFB* const*>(value->layers);
                    if (new_compositionlayerpassthroughfb_value[value_layers_inc]->type == XR_TYPE_COMPOSITION_LAYER_PASSTHROUGH_FB) {
                        if (nullptr != new_compositionlayerpassthroughfb_value) {
                            xr_result = ValidateXrStruct(instance_info, command_name,
                                                                            objects_info, check_members, true, new_compositionlayerpassthroughfb_value[value_layers_inc]);
                            if (XR_SUCCESS != xr_result) {
                                std::string error_message = "Structure XrFrameEndInfo member layers";
                                error_message += "[";
                                error_message += std::to_string(value_layers_inc);
                                error_message += "]";
                                error_message += " is invalid";
                                CoreValidLogMessage(instance_info, "VUID-XrFrameEndInfo-layers-parameter",
                                                    VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                                                    objects_info,
                                                    error_message);
                                return XR_ERROR_VALIDATION_FAILURE;
                                break;
                            } else {
                                continue;
                                }
                            }
                    }
                }
            }
            // Validate if XrCompositionLayerBaseHeader is a child structure of type XrCompositionLayerPassthroughHTC and it is valid
            {
                if (value->layers != nullptr) {
                    const XrCompositionLayerPassthroughHTC* const* new_compositionlayerpassthroughhtc_value = reinterpret_cast<const XrCompositionLayerPassthroughHTC* const*>(value->layers);
                    if (new_compositionlayerpassthroughhtc_value[value_layers_inc]->type == XR_TYPE_COMPOSITION_LAYER_PASSTHROUGH_HTC) {
                        if (nullptr != new_compositionlayerpassthroughhtc_value) {
                            xr_result = ValidateXrStruct(instance_info, command_name,
                                                                            objects_info, check_members, true, new_compositionlayerpassthroughhtc_value[value_layers_inc]);
                            if (XR_SUCCESS != xr_result) {
                                std::string error_message = "Structure XrFrameEndInfo member layers";
                                error_message += "[";
                                error_message += std::to_string(value_layers_inc);
                                error_message += "]";
                                error_message += " is invalid";
                                CoreValidLogMessage(instance_info, "VUID-XrFrameEndInfo-layers-parameter",
                                                    VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                                                    objects_info,
                                                    error_message);
                                return XR_ERROR_VALIDATION_FAILURE;
                                break;
                            } else {
                                continue;
                                }
                            }
                    }
                }
            }
            // Validate that the base-structure XrCompositionLayerBaseHeader is valid
            if (nullptr != value->layers[value_layers_inc]) {
                xr_result = ValidateXrStruct(instance_info, command_name,
                                                                objects_info, check_members, true, value->layers[value_layers_inc]);
                if (XR_SUCCESS != xr_result) {
                    CoreValidLogMessage(instance_info, "VUID-XrFrameEndInfo-layers-parameter",
                                        VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                                        objects_info,
                                        "Structure XrFrameEndInfo member layers is invalid");
                    return xr_result;
                }
            }
        }
    }
    // Everything checked out properly
    return xr_result;
}